

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<int>::Subst_Backward(TPZMatrix<int> *this,TPZFMatrix<int> *B)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_01;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar7;
  long lVar8;
  int local_44;
  TPZFMatrix<int> *local_40;
  long local_38;
  int extraout_var_00;
  
  lVar6 = (B->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar3 = 0;
  if ((lVar6 == CONCAT44(extraout_var,iVar2)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar6 = CONCAT44(extraout_var_00,iVar2);
    iVar3 = 1;
    local_40 = B;
    if (lVar6 != 0 && -1 < extraout_var_00) {
      do {
        lVar8 = lVar6 + -1;
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar8,lVar8);
        if (0 < (B->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol) {
          lVar7 = 0;
          do {
            local_38 = lVar7;
            iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
            lVar7 = CONCAT44(extraout_var_01,iVar3);
            iVar3 = 0;
            if (lVar6 < lVar7) {
              iVar3 = 0;
              do {
                lVar7 = lVar7 + -1;
                iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar8,lVar7);
                iVar5 = (*(local_40->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                          _vptr_TPZSavable[0x24])(local_40,lVar7,local_38);
                iVar3 = iVar3 + iVar5 * iVar4;
              } while (lVar6 < lVar7);
            }
            lVar7 = local_38;
            B = local_40;
            iVar4 = (*(local_40->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x24])(local_40,lVar8,local_38);
            local_44 = (iVar4 - iVar3) / iVar2;
            (*(B->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
                      (B,lVar8,lVar7,&local_44,in_R8,in_R9,iVar2);
            lVar7 = lVar7 + 1;
          } while (lVar7 < (B->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol);
        }
        bVar1 = 1 < lVar6;
        lVar6 = lVar8;
      } while (bVar1);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}